

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

void __thiscall
duckdb::TableIndexList::AddIndex
          (TableIndexList *this,
          unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index)

{
  ::std::mutex::lock(&this->indexes_lock);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>,std::allocator<duckdb::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>,std::allocator<duckdb::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>>>
              *)&this->indexes,index);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void TableIndexList::AddIndex(unique_ptr<Index> index) {
	D_ASSERT(index);
	lock_guard<mutex> lock(indexes_lock);
	indexes.push_back(std::move(index));
}